

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void Merge_Sort<int>(int *a,int left,int right,_func_bool_int_int *compare)

{
  bool bVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int left_00;
  int right_00;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (left < right) {
    right_00 = (right + left) / 2;
    Merge_Sort<int>(a,left,right_00,compare);
    left_00 = right_00 + 1;
    Merge_Sort<int>(a,left_00,right,compare);
    uVar6 = (ulong)left;
    uVar7 = uVar6;
    iVar4 = left;
    if (right_00 < left || right <= right_00) {
      uVar7 = (ulong)(uint)left;
      piVar2 = temp;
    }
    else {
      do {
        bVar1 = (*compare)(a[left_00],a[iVar4]);
        piVar2 = temp;
        lVar3 = (long)left_00;
        if (bVar1) {
          lVar3 = (long)iVar4;
        }
        iVar4 = iVar4 + (uint)bVar1;
        left_00 = left_00 + (uint)!bVar1;
        temp[uVar7] = a[lVar3];
        uVar7 = uVar7 + 1;
      } while ((iVar4 <= right_00) && (left_00 <= right));
    }
    iVar5 = (int)uVar7;
    if (iVar4 <= right_00) {
      lVar3 = 0;
      do {
        piVar2[iVar5 + lVar3] = a[iVar4 + lVar3];
        lVar3 = lVar3 + 1;
      } while ((right_00 - iVar4) + 1 != (int)lVar3);
      iVar5 = iVar5 + (int)lVar3;
    }
    if (left_00 <= right) {
      lVar3 = 0;
      do {
        piVar2[iVar5 + lVar3] = a[left_00 + lVar3];
        lVar3 = lVar3 + 1;
      } while ((right + 1) - left_00 != (int)lVar3);
    }
    lVar3 = 0;
    do {
      a[uVar6 + lVar3] = piVar2[uVar6 + lVar3];
      lVar3 = lVar3 + 1;
    } while ((right + 1) - left != (int)lVar3);
  }
  return;
}

Assistant:

inline void Merge_Sort(T * a, int left, int right, bool(*compare)(T, T))
{
	int mid;
	if (left < right) {
		mid = (left + right) / 2;
		Merge_Sort(a, left, mid, compare);//nữa bên trái
		Merge_Sort(a, mid + 1, right, compare);//nữa phải
		Merge(a, left, mid, right, compare);
	}
	return;
}